

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comm.c
# Opt level: O3

void write_to_buffer(DESCRIPTOR_DATA *d,char *txt,int length)

{
  char *__src;
  size_t sVar1;
  char *__dest;
  int iVar2;
  int iVar3;
  string_view fmt;
  
  if (length < 1) {
    sVar1 = strlen(txt);
    length = (int)sVar1;
  }
  iVar2 = d->outtop;
  if (iVar2 == 0) {
    iVar2 = 0;
    if (d->fcommand == false) {
      *d->outbuf = '\n';
      d->outbuf[1] = '\r';
      d->outtop = 2;
      iVar2 = 2;
    }
  }
  iVar3 = d->outsize;
  if (length + iVar2 < iVar3) {
    __dest = d->outbuf;
  }
  else {
    do {
      if (31999 < iVar3) {
        fmt._M_str = "Buffer overflow. Closing.\n\r";
        fmt._M_len = 0x1b;
        CLogger::Warn<>((CLogger *)&RS.field_0x140,fmt);
        d->outtop = 0;
        close_socket(d);
        return;
      }
      iVar3 = iVar3 * 2;
      d->outsize = iVar3;
      __dest = (char *)operator_new__((long)iVar3);
      __src = d->outbuf;
      strncpy(__dest,__src,(long)iVar2);
      if (__src != (char *)0x0) {
        operator_delete__(__src);
        iVar3 = d->outsize;
        iVar2 = d->outtop;
      }
      d->outbuf = __dest;
    } while (iVar3 <= length + iVar2);
  }
  strcpy(__dest + iVar2,txt);
  d->outtop = d->outtop + length;
  return;
}

Assistant:

void write_to_buffer(DESCRIPTOR_DATA *d, const char *txt, int length)
{
	/*
	 * Find length in case caller didn't.
	 */
	if (length <= 0)
		length = strlen(txt);

	/*
	 * Initial \n\r if needed.
	 */
	if (d->outtop == 0 && !d->fcommand)
	{
		d->outbuf[0] = '\n';
		d->outbuf[1] = '\r';
		d->outtop = 2;
	}

	/*
	 * Expand the buffer as needed.
	 */
	while (d->outtop + length >= d->outsize)
	{
		char *outbuf;

		if (d->outsize >= 32000)
		{
			RS.Logger.Warn("Buffer overflow. Closing.\n\r");
			d->outtop = 0;
			close_socket(d);
			return;
		}

		d->outsize *= 2;
		outbuf = new char[d->outsize];
		strncpy(outbuf, d->outbuf, d->outtop);
		delete[] d->outbuf;
		d->outbuf = outbuf;
	}

	/*
	 * Copy.
	 */
	strcpy(d->outbuf + d->outtop, txt);
	d->outtop += length;
}